

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Bytes __thiscall Omega_h::lt_each<double>(Omega_h *this,Read<double> *a,Read<double> *b)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  ulong uVar3;
  ulong uVar4;
  void *extraout_RDX;
  LO n;
  size_t sVar5;
  Bytes BVar6;
  Write<signed_char> c;
  type f;
  allocator local_71;
  Write<signed_char> local_70;
  Write<signed_char> local_60;
  type local_50;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  pAVar2 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar4 = pAVar2->size;
  }
  else {
    uVar4 = (ulong)pAVar2 >> 3;
  }
  if ((int)(uVar3 >> 3) == (int)(uVar4 >> 3)) {
    if (((ulong)pAVar1 & 1) == 0) {
      sVar5 = pAVar1->size;
    }
    else {
      sVar5 = (ulong)pAVar1 >> 3;
    }
    std::__cxx11::string::string((string *)&local_50,"",&local_71);
    Write<signed_char>::Write(&local_70,(LO)(sVar5 >> 3),(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    Write<signed_char>::Write(&local_50.c,&local_70);
    Write<double>::Write((Write<double> *)&local_50.a,&a->write_);
    Write<double>::Write((Write<double> *)&local_50.b,&b->write_);
    if (((ulong)local_70.shared_alloc_.alloc & 1) == 0) {
      n = (LO)(local_70.shared_alloc_.alloc)->size;
    }
    else {
      n = (LO)((ulong)local_70.shared_alloc_.alloc >> 3);
    }
    parallel_for<Omega_h::lt_each<double>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
              (n,&local_50,"lt_each");
    Write<signed_char>::Write(&local_60,&local_70);
    Read<signed_char>::Read((Read<signed_char> *)this,&local_60);
    Write<signed_char>::~Write(&local_60);
    lt_each<double>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)&local_50);
    Write<signed_char>::~Write(&local_70);
    BVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
    BVar6.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Bytes)BVar6.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x101);
}

Assistant:

Bytes lt_each(Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<I8> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = (a[i] < b[i]); };
  parallel_for(c.size(), f, "lt_each");
  return c;
}